

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::ShaderSubroutine::FunctionalTest20_21::testCase(FunctionalTest20_21 *this,GLuint *bit_field)

{
  ostringstream *this_00;
  ulong uVar1;
  bool bVar2;
  MessageBuilder *pMVar3;
  subroutineUniformSet *psVar4;
  long lVar5;
  GLuint i;
  long lVar6;
  subroutineUniformSet *set;
  ulong uVar7;
  subroutineUniformSet subroutine_indices [5];
  subroutineUniformSet captured_subroutine_indices [5];
  undefined1 local_1a8 [384];
  
  psVar4 = subroutine_indices;
  set = subroutine_indices;
  for (lVar6 = 0; lVar6 != 5; lVar6 = lVar6 + 1) {
    subroutineUniformSet::set(psVar4,bit_field[lVar6],this->m_subroutine_indices);
    psVar4 = psVar4 + 1;
  }
  for (lVar6 = 0x12; lVar6 != 0x16; lVar6 = lVar6 + 1) {
    (**(code **)(**(long **)(this->m_program_pipelines + lVar6 * 2 + -0x1e) + 0x40))();
    updateCurrentSubroutineSet(this,set);
    set = set + 1;
  }
  (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[8])();
  updateCurrentSubroutineSet(this,subroutine_indices + 4);
  psVar4 = captured_subroutine_indices;
  for (lVar6 = 0x12; lVar6 != 0x16; lVar6 = lVar6 + 1) {
    (**(code **)(**(long **)(this->m_program_pipelines + lVar6 * 2 + -0x1e) + 0x40))();
    captureCurrentSubroutineSet(this,psVar4);
    psVar4 = psVar4 + 1;
  }
  (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[8])();
  captureCurrentSubroutineSet(this,captured_subroutine_indices + 4);
  lVar6 = 0;
  uVar1 = 0;
  do {
    uVar7 = uVar1;
    lVar5 = lVar6;
    if (lVar5 == 100) goto LAB_00a277b1;
    bVar2 = subroutineUniformSet::operator!=
                      ((subroutineUniformSet *)
                       ((long)&subroutine_indices[0].m_vertex_shader_stage + lVar5),
                       (subroutineUniformSet *)
                       ((long)&captured_subroutine_indices[0].m_vertex_shader_stage + lVar5));
    lVar6 = lVar5 + 0x14;
    uVar1 = uVar7 + 1;
  } while (!bVar2);
  local_1a8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
  this_00 = (ostringstream *)(local_1a8 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::operator<<((ostream *)this_00,"Error.");
  std::operator<<((ostream *)this_00," Context: ");
  std::ostream::_M_insert<unsigned_long>((ulong)this_00);
  std::operator<<((ostream *)this_00," VS, expected: ");
  pMVar3 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)local_1a8,
                      (uint *)((long)&subroutine_indices[0].m_vertex_shader_stage + lVar5));
  std::operator<<(&(pMVar3->m_str).super_basic_ostream<char,_std::char_traits<char>_>," captured: ")
  ;
  pMVar3 = tcu::MessageBuilder::operator<<
                     (pMVar3,(uint *)((long)&captured_subroutine_indices[0].m_vertex_shader_stage +
                                     lVar5));
  std::operator<<(&(pMVar3->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                  " TCS, expected: ");
  pMVar3 = tcu::MessageBuilder::operator<<
                     (pMVar3,(uint *)((long)&subroutine_indices[0].
                                             m_tesselation_control_shader_stage + lVar5));
  std::operator<<(&(pMVar3->m_str).super_basic_ostream<char,_std::char_traits<char>_>," captured: ")
  ;
  pMVar3 = tcu::MessageBuilder::operator<<
                     (pMVar3,(uint *)((long)&captured_subroutine_indices[0].
                                             m_tesselation_control_shader_stage + lVar5));
  std::operator<<(&(pMVar3->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                  " TES, expected: ");
  pMVar3 = tcu::MessageBuilder::operator<<
                     (pMVar3,(uint *)((long)&subroutine_indices[0].
                                             m_tesselation_evaluation_shader_stage + lVar5));
  std::operator<<(&(pMVar3->m_str).super_basic_ostream<char,_std::char_traits<char>_>," captured: ")
  ;
  pMVar3 = tcu::MessageBuilder::operator<<
                     (pMVar3,(uint *)((long)&captured_subroutine_indices[0].
                                             m_tesselation_evaluation_shader_stage + lVar5));
  std::operator<<(&(pMVar3->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                  " GS, expected: ");
  pMVar3 = tcu::MessageBuilder::operator<<
                     (pMVar3,(uint *)((long)&subroutine_indices[0].m_geometry_shader_stage + lVar5))
  ;
  std::operator<<(&(pMVar3->m_str).super_basic_ostream<char,_std::char_traits<char>_>," captured: ")
  ;
  pMVar3 = tcu::MessageBuilder::operator<<
                     (pMVar3,(uint *)((long)&captured_subroutine_indices[0].m_geometry_shader_stage
                                     + lVar5));
  std::operator<<(&(pMVar3->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                  " FS, expected: ");
  pMVar3 = tcu::MessageBuilder::operator<<
                     (pMVar3,(uint *)((long)&subroutine_indices[0].m_fragment_shader_stage + lVar5))
  ;
  std::operator<<(&(pMVar3->m_str).super_basic_ostream<char,_std::char_traits<char>_>," captured: ")
  ;
  pMVar3 = tcu::MessageBuilder::operator<<
                     (pMVar3,(uint *)((long)&captured_subroutine_indices[0].m_fragment_shader_stage
                                     + lVar5));
  tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
LAB_00a277b1:
  return 4 < uVar7;
}

Assistant:

bool FunctionalTest20_21::testCase(const glw::GLuint bit_field[5])
{
	/* Storage for subroutine indices */
	subroutineUniformSet captured_subroutine_indices[m_n_shared_contexts + 1];
	subroutineUniformSet subroutine_indices[m_n_shared_contexts + 1];

	/* Prepare subroutine_indices with bit fields */
	for (GLuint i = 0; i < m_n_shared_contexts + 1; ++i)
	{
		subroutine_indices[i].set(bit_field[i], m_subroutine_indices);
	};

	/* Update subroutine uniforms, each context gets different set */
	for (GLuint i = 0; i < m_n_shared_contexts; ++i)
	{
		m_shared_contexts[i]->makeCurrent();
		updateCurrentSubroutineSet(subroutine_indices[i]);
	}

	m_context.getRenderContext().makeCurrent();
	updateCurrentSubroutineSet(subroutine_indices[m_n_shared_contexts]);

	/* Capture subroutine uniforms */
	for (GLuint i = 0; i < m_n_shared_contexts; ++i)
	{
		m_shared_contexts[i]->makeCurrent();
		captureCurrentSubroutineSet(captured_subroutine_indices[i]);
	}

	m_context.getRenderContext().makeCurrent();
	captureCurrentSubroutineSet(captured_subroutine_indices[m_n_shared_contexts]);

	/* Verify that captured uniforms match expected values */
	for (GLuint i = 0; i < m_n_shared_contexts + 1; ++i)
	{
		if (subroutine_indices[i] != captured_subroutine_indices[i])
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "Error."
				<< " Context: " << i << " VS, expected: " << subroutine_indices[i].m_vertex_shader_stage
				<< " captured: " << captured_subroutine_indices[i].m_vertex_shader_stage
				<< " TCS, expected: " << subroutine_indices[i].m_tesselation_control_shader_stage
				<< " captured: " << captured_subroutine_indices[i].m_tesselation_control_shader_stage
				<< " TES, expected: " << subroutine_indices[i].m_tesselation_evaluation_shader_stage
				<< " captured: " << captured_subroutine_indices[i].m_tesselation_evaluation_shader_stage
				<< " GS, expected: " << subroutine_indices[i].m_geometry_shader_stage
				<< " captured: " << captured_subroutine_indices[i].m_geometry_shader_stage
				<< " FS, expected: " << subroutine_indices[i].m_fragment_shader_stage
				<< " captured: " << captured_subroutine_indices[i].m_fragment_shader_stage << tcu::TestLog::EndMessage;

			return false;
		}
	}

	return true;
}